

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persp_rh_no.c
# Opt level: O0

void glmc_persp_decomp_rh_no
               (vec4 *proj,float *nearZ,float *farZ,float *top,float *bottom,float *left,
               float *right)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float *left_local;
  float *bottom_local;
  float *top_local;
  float *farZ_local;
  float *nearZ_local;
  vec4 *proj_local;
  float n_m00;
  float n_m11;
  float f;
  float n;
  float m32;
  float m22;
  float m21;
  float m20;
  float m11;
  float m00;
  
  fVar1 = proj[2][0];
  fVar2 = proj[2][1];
  fVar3 = proj[2][2];
  fVar4 = proj[3][2];
  fVar5 = fVar4 / (fVar3 - 1.0);
  fVar6 = fVar5 / proj[1][1];
  fVar7 = fVar5 / (*proj)[0];
  *nearZ = fVar5;
  *farZ = fVar4 / (fVar3 + 1.0);
  *bottom = fVar6 * (fVar2 - 1.0);
  *top = fVar6 * (fVar2 + 1.0);
  *left = fVar7 * (fVar1 - 1.0);
  *right = fVar7 * (fVar1 + 1.0);
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_persp_decomp_rh_no(mat4 proj,
                        float * __restrict nearZ, float * __restrict farZ,
                        float * __restrict top,   float * __restrict bottom,
                        float * __restrict left,  float * __restrict right) {
  glm_persp_decomp_rh_no(proj, nearZ, farZ, top, bottom, left, right);
}